

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# library_open.c
# Opt level: O1

mpt_libhandle * mpt_library_attach(mpt_libhandle *lh)

{
  uintptr_t uVar1;
  int *piVar2;
  uintptr_t uVar3;
  uintptr_t uVar4;
  int iVar5;
  
  if (lh == (mpt_libhandle *)0x0) {
    iVar5 = 0x16;
  }
  else {
    uVar1 = (lh->_ref)._val;
    iVar5 = 0xb;
    if (uVar1 != 0) {
      uVar3 = uVar1 + 1;
      uVar4 = uVar3;
      if (uVar3 == 0) {
        uVar4 = uVar1;
      }
      (lh->_ref)._val = uVar4;
      if (uVar3 != 0) {
        return lh;
      }
    }
  }
  piVar2 = __errno_location();
  *piVar2 = iVar5;
  return (mpt_libhandle *)0x0;
}

Assistant:

extern MPT_STRUCT(libhandle) *mpt_library_attach(MPT_STRUCT(libhandle) *lh)
{
	if (!lh) {
		errno = EINVAL;
		return 0;
	}
	if (!__mpt_library_proxy_addref(&lh->_ref)) {
		errno = EAGAIN;
		return 0;
	}
	return lh;
}